

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

void nni_device(nni_aio *aio,nni_sock *s1,nni_sock *s2)

{
  _Bool _Var1;
  nng_err result;
  device_data *pdStack_28;
  int rv;
  device_data *d;
  nni_sock *s2_local;
  nni_sock *s1_local;
  nni_aio *aio_local;
  
  d = (device_data *)s2;
  s2_local = s1;
  s1_local = (nni_sock *)aio;
  nni_aio_reset(aio);
  nni_mtx_lock(&device_mtx);
  result = device_init(&stack0xffffffffffffffd8,s2_local,(nni_sock *)d);
  if (result == NNG_OK) {
    _Var1 = nni_aio_start((nni_aio *)s1_local,device_cancel,pdStack_28);
    if (!_Var1) {
      nni_mtx_unlock(&device_mtx);
      nni_reap(&device_reap,pdStack_28);
    }
    device_start(pdStack_28,(nni_aio *)s1_local);
    nni_mtx_unlock(&device_mtx);
  }
  else {
    nni_mtx_unlock(&device_mtx);
    nni_aio_finish_error((nni_aio *)s1_local,result);
  }
  return;
}

Assistant:

void
nni_device(nni_aio *aio, nni_sock *s1, nni_sock *s2)
{
	device_data *d;
	int          rv;

	nni_aio_reset(aio);
	nni_mtx_lock(&device_mtx);
	if ((rv = device_init(&d, s1, s2)) != 0) {
		nni_mtx_unlock(&device_mtx);
		nni_aio_finish_error(aio, rv);
		return;
	}
	if (!nni_aio_start(aio, device_cancel, d)) {
		nni_mtx_unlock(&device_mtx);
		nni_reap(&device_reap, d);
	}
	device_start(d, aio);
	nni_mtx_unlock(&device_mtx);
}